

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordCase::iterate(TessCoordCase *this)

{
  float tessLevel;
  SpacingMode SVar1;
  TessPrimitiveType TVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log;
  RenderContext *pRVar3;
  pointer pVVar4;
  float __x;
  pointer pvVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  int iVar10;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *__dest;
  ulong uVar11;
  undefined8 *__dest_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  pointer pvVar14;
  Surface *pSVar15;
  pointer pvVar16;
  float *pfVar17;
  void *__buf;
  void *__buf_00;
  char *description;
  undefined8 *puVar18;
  ulong uVar19;
  long lVar20;
  undefined8 *puVar21;
  qpTestResult testResult;
  pointer pVVar22;
  int *piVar23;
  int *outerDst;
  float *outer_00;
  int *in_R9;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coords;
  uint uVar24;
  ulong uVar25;
  size_type __n;
  long lVar26;
  bool bVar27;
  bool bVar28;
  undefined4 uVar29;
  float fVar30;
  undefined1 auVar31 [16];
  long local_530;
  string local_520;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  int local_4e8;
  int local_4e4;
  string local_4e0;
  long local_4c0;
  size_type local_4b8;
  Result tfResult;
  RandomViewport viewport;
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  caseReferences;
  Surface resVisual;
  Surface refVisual;
  undefined1 local_418 [8];
  undefined8 uStack_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8 [4];
  ios_base local_3a0 [264];
  int inner;
  int iStack_294;
  char *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  int outer [3];
  int iStack_1fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [6];
  ios_base local_190 [272];
  TFHandler tfHandler;
  
  log = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar8 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar8),0x10,0x10,dVar9);
  dVar9 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar8 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar26 = CONCAT44(extraout_var_00,iVar8);
  local_4ec = (**(code **)(lVar26 + 0xb48))(dVar9,"u_tessLevelInner0");
  local_4f0 = (**(code **)(lVar26 + 0xb48))(dVar9,"u_tessLevelInner1");
  local_4f4 = (**(code **)(lVar26 + 0xb48))(dVar9,"u_tessLevelOuter0");
  local_4f8 = (**(code **)(lVar26 + 0xb48))(dVar9,"u_tessLevelOuter1");
  local_4fc = (**(code **)(lVar26 + 0xb48))(dVar9,"u_tessLevelOuter2");
  local_4c0 = lVar26;
  local_500 = (**(code **)(lVar26 + 0xb48))(dVar9,"u_tessLevelOuter3");
  SVar1 = this->m_spacing;
  __dest = (undefined8 *)operator_new(0xd8);
  puVar21 = __dest + 0x1b;
  if (SVar1 == SPACINGMODE_EQUAL) {
    memcpy(__dest,(anonymous_namespace)::TessCoordCase::genTessLevelCases()::rawTessLevelCases,0xd8)
    ;
    puVar18 = puVar21;
  }
  else {
    lVar26 = 0;
    puVar18 = __dest;
    do {
      local_408._M_allocated_capacity =
           *(undefined8 *)
            ((anonymous_namespace)::TessCoordCase::genTessLevelCases()::rawTessLevelCases +
            lVar26 * 0x18 + 0x10);
      local_418 = *(undefined1 (*) [8])
                   ((anonymous_namespace)::TessCoordCase::genTessLevelCases()::rawTessLevelCases +
                   lVar26 * 0x18);
      uStack_410 = *(pointer *)
                    ((anonymous_namespace)::TessCoordCase::genTessLevelCases()::rawTessLevelCases +
                    lVar26 * 0x18 + 8);
      SVar1 = this->m_spacing;
      uVar19 = (ulong)SVar1;
      iVar8 = getClampedRoundedTessLevel(SVar1,(float)local_418._0_4_);
      iVar10 = getClampedRoundedTessLevel(SVar1,(float)local_418._4_4_);
      local_418 = (undefined1  [8])CONCAT44((float)iVar10,(float)iVar8);
      lVar20 = 2;
      do {
        iVar8 = getClampedRoundedTessLevel(SVar1,*(float *)(local_418 + lVar20 * 4));
        *(float *)(local_418 + lVar20 * 4) = (float)iVar8;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        if (((1.0 < (float)local_408._M_allocated_capacity._0_4_ ||
              (1.0 < (float)uStack_410 || 1.0 < uStack_410._4_4_)) &&
            ((float)local_418._0_4_ == 1.0)) && (!NAN((float)local_418._0_4_))) {
          local_418._0_4_ = 0xbf800000;
          if (SVar1 < SPACINGMODE_LAST) {
            local_418._0_4_ = *(undefined4 *)(&DAT_0094ff24 + uVar19 * 4);
          }
        }
      }
      else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
        auVar31._4_4_ = -(uint)(1.0 < uStack_410._4_4_);
        auVar31._0_4_ = -(uint)(1.0 < (float)uStack_410);
        auVar31._8_4_ = -(uint)(1.0 < (float)local_408._M_allocated_capacity._0_4_);
        auVar31._12_4_ = -(uint)(1.0 < (float)local_408._M_allocated_capacity._4_4_);
        iVar8 = movmskps(1,auVar31);
        if (iVar8 != 0) {
          if (((float)local_418._0_4_ == 1.0) && (!NAN((float)local_418._0_4_))) {
            local_418._0_4_ = 0xbf800000;
            if (SVar1 < SPACINGMODE_LAST) {
              local_418._0_4_ = *(undefined4 *)(&DAT_0094ff24 + uVar19 * 4);
            }
          }
          if (((float)local_418._4_4_ == 1.0) && (!NAN((float)local_418._4_4_))) {
            uVar29 = 0xbf800000;
            if (SVar1 < SPACINGMODE_LAST) {
              uVar29 = *(undefined4 *)(&DAT_0094ff24 + uVar19 * 4);
            }
            local_418._4_4_ = uVar29;
          }
        }
      }
      if (puVar18 == puVar21) {
        uVar19 = (long)puVar18 - (long)__dest;
        if (uVar19 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar11 = ((long)uVar19 >> 3) * -0x5555555555555555;
        uVar13 = uVar11;
        if (puVar18 == __dest) {
          uVar13 = 1;
        }
        uVar25 = uVar13 + uVar11;
        if (0x555555555555554 < uVar25) {
          uVar25 = 0x555555555555555;
        }
        if (CARRY8(uVar13,uVar11)) {
          uVar25 = 0x555555555555555;
        }
        if (uVar25 == 0) {
          __dest_00 = (undefined8 *)0x0;
        }
        else {
          __dest_00 = (undefined8 *)operator_new(uVar25 * 0x18);
        }
        *(size_type *)((long)__dest_00 + uVar19 + 0x10) = local_408._M_allocated_capacity;
        *(undefined8 *)((long)__dest_00 + uVar19) = local_418;
        ((undefined8 *)((long)__dest_00 + uVar19))[1] = uStack_410;
        if (0 < (long)uVar19) {
          memmove(__dest_00,__dest,uVar19);
        }
        if (__dest != (undefined8 *)0x0) {
          operator_delete(__dest,uVar19);
        }
        puVar18 = (undefined8 *)(uVar19 + (long)__dest_00);
        puVar21 = __dest_00 + uVar25 * 3;
        __dest = __dest_00;
      }
      else {
        puVar18[2] = local_408._M_allocated_capacity;
        *puVar18 = local_418;
        puVar18[1] = uStack_410;
      }
      puVar18 = puVar18 + 3;
      lVar26 = lVar26 + 1;
    } while (lVar26 != 9);
  }
  __n = ((long)puVar18 - (long)__dest >> 3) * -0x5555555555555555;
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::vector(&caseReferences,__n,(allocator_type *)local_418);
  uVar24 = (uint)__n;
  if (0 < (int)uVar24) {
    lVar26 = (long)__dest + 0xc;
    uVar19 = 0;
    do {
      TVar2 = this->m_primitiveType;
      uVar13 = (ulong)TVar2;
      if (uVar13 < 3) {
        pfVar17 = (float *)(__dest + uVar19 * 3 + 1);
        fVar30 = *pfVar17;
        if (fVar30 <= 0.0) goto LAB_003c2906;
        SVar1 = this->m_spacing;
        piVar23 = (int *)0x0;
        do {
          outerDst = piVar23;
          if ((int *)((long)*(int **)(&DAT_0094ff48 + uVar13 * 8) - 1U) == piVar23)
          goto LAB_003c289d;
          outerDst = (int *)((long)piVar23 + 1);
          lVar20 = (long)piVar23 * 4;
          piVar23 = outerDst;
          in_R9 = outerDst;
        } while (0.0 < *(float *)(lVar26 + lVar20));
        if (outerDst < *(int **)(&DAT_0094ff48 + uVar13 * 8)) goto LAB_003c2906;
LAB_003c289d:
        if (uVar13 == 2) {
          tessLevel = *(float *)((long)(__dest + uVar19 * 3) + 0xc);
          __x = 1.0;
          if (1.0 <= fVar30) {
            __x = fVar30;
          }
          fVar30 = ceilf(__x);
          iVar8 = getClampedRoundedTessLevel(SVar1,tessLevel);
          generateReferenceIsolineTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     local_418,(int)fVar30,iVar8);
        }
        else if (TVar2 == TESSPRIMITIVETYPE_QUADS) {
          getClampedRoundedQuadTessLevels(SVar1,(float *)(__dest + uVar19 * 3),pfVar17,&inner,outer)
          ;
          in_R9 = (int *)(ulong)(uint)outer[1];
          generateReferenceQuadTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     local_418,SVar1,inner,iStack_294,outer[0],outer[1],(int)stack0xfffffffffffffe00
                     ,iStack_1fc);
        }
        else {
          if (TVar2 != TESSPRIMITIVETYPE_TRIANGLES) goto LAB_003c2906;
          getClampedRoundedTriangleTessLevels(SVar1,pfVar17,(float *)&inner,outer,outerDst);
          in_R9 = (int *)((ulong)stack0xfffffffffffffe00 & 0xffffffff);
          generateReferenceTriangleTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     local_418,SVar1,inner,outer[0],outer[1],outer[2]);
        }
      }
      else {
LAB_003c2906:
        local_418 = (undefined1  [8])0x0;
        uStack_410 = (pointer)0x0;
        local_408._M_allocated_capacity = 0;
      }
      pVVar22 = caseReferences.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar19].
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar4 = caseReferences.
               super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19].
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar19].
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_418;
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar19].
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish = uStack_410;
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar19].
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_408._M_allocated_capacity;
      local_418 = (undefined1  [8])0x0;
      uStack_410 = (pointer)0x0;
      local_408._M_allocated_capacity = 0;
      if ((pVVar22 != (pointer)0x0) &&
         (operator_delete(pVVar22,(long)pVVar4 - (long)pVVar22), local_418 != (undefined1  [8])0x0))
      {
        operator_delete((void *)local_418,local_408._M_allocated_capacity - (long)local_418);
      }
      uVar19 = uVar19 + 1;
      lVar26 = lVar26 + 0x18;
    } while (uVar19 != (uVar24 & 0x7fffffff));
  }
  pvVar14 = caseReferences.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
  pvVar16 = caseReferences.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar14 !=
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pVVar22 = ((caseReferences.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pVVar4 = (pvVar14->
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      in_R9 = (int *)((long)(pvVar16->
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar22);
      pvVar5 = pvVar14;
      if ((int *)((long)(pvVar14->
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) <= in_R9) {
        pvVar5 = pvVar16;
        pVVar4 = pVVar22;
      }
      pVVar22 = pVVar4;
      pvVar16 = pvVar5;
      pvVar14 = pvVar14 + 1;
    } while (pvVar14 !=
             caseReferences.
             super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&tfHandler,((this->super_TestCase).m_context)->m_renderCtx,
             (int)((ulong)((long)(pvVar16->
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar16->
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555);
  lVar26 = local_4c0;
  (**(code **)(local_4c0 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar26 + 0x1680))(dVar9);
  (**(code **)(lVar26 + 0xfd8))(0x8e72);
  if ((int)uVar24 < 1) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    bVar27 = true;
    local_530 = 0;
    uVar19 = 1;
    do {
      iVar8 = (int)in_R9;
      local_418 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_410,"Tessellation levels: ",0x15);
      uVar13 = (ulong)this->m_primitiveType;
      pfVar17 = (float *)0xffffffff;
      outer_00 = (float *)0xffffffff;
      if (uVar13 < 3) {
        pfVar17 = (float *)(ulong)*(uint *)(&DAT_0093f41c + uVar13 * 4);
        outer_00 = (float *)(ulong)*(uint *)(&DAT_0094ff30 + uVar13 * 4);
      }
      (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                ((string *)outer,(_anonymous_namespace_ *)(local_530 + (long)__dest),pfVar17,
                 (int)local_530 + (int)__dest + 8,outer_00,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_410,(char *)outer._0_8_,(long)stack0xfffffffffffffe00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outer._0_8_ != local_1f8) {
        operator_delete((void *)outer._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_410);
      std::ios_base::~ios_base(local_3a0);
      lVar26 = local_4c0;
      (**(code **)(local_4c0 + 0x14e0))(local_4ec);
      (**(code **)(lVar26 + 0x14e0))(local_4f0);
      (**(code **)(lVar26 + 0x14e0))(local_4f4);
      (**(code **)(lVar26 + 0x14e0))(local_4f8);
      (**(code **)(lVar26 + 0x14e0))(local_4fc);
      (**(code **)(lVar26 + 0x14e0))(local_500);
      err = (**(code **)(lVar26 + 0x800))();
      glu::checkError(err,"Setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x81e);
      pvVar14 = caseReferences.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                (&tfResult,&tfHandler,dVar9,0,0,(VertexArrayBinding *)0x0,1);
      local_4e8 = (int)((ulong)(*(long *)((long)&(pvVar14->
                                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish +
                                         local_530) -
                               *(long *)((long)&(pvVar14->
                                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start +
                                        local_530)) >> 2) * -0x55555555;
      local_4e4 = tfResult.numPrimitives;
      if (tfResult.numPrimitives == local_4e8) {
        local_418 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_410,
                   "Note: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ",0x41);
        std::ostream::operator<<(&uStack_410,tfResult.numPrimitives);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_418 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_410,
                   "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ",0x44);
        std::ostream::operator<<((ostringstream *)&uStack_410,tfResult.numPrimitives);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_410,", reference value is ",0x15);
        std::ostream::_M_insert<unsigned_long>((ulong)&uStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_410," (logging further info anyway)",0x1e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_410);
      std::ios_base::~ios_base(local_3a0);
      if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
        local_418 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_410,
                   "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively"
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_003c2f16:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_410);
        std::ios_base::~ios_base(local_3a0);
      }
      else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        local_418 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_410,
                   "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively"
                   ,0x78);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_003c2f16;
      }
      TVar2 = this->m_primitiveType;
      tcu::Surface::Surface(&refVisual);
      tcu::Surface::Surface(&resVisual);
      coords = (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               ((long)&(pvVar14->
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_530);
      drawTessCoordVisualization(&refVisual,TVar2,coords);
      drawTessCoordVisualization(&resVisual,TVar2,&tfResult.varying);
      local_418._0_4_ = 0xffff0000;
      bVar6 = oneWayComparePointSets
                        ((TestLog *)&log->_M_allocated_capacity,&refVisual,TVar2,coords,
                         &tfResult.varying,"reference","result",(RGBA *)local_418);
      local_418._0_4_ = 0xff0000ff;
      in_R9 = (int *)0x98c255;
      bVar7 = oneWayComparePointSets
                        ((TestLog *)&log->_M_allocated_capacity,&resVisual,TVar2,&tfResult.varying,
                         coords,"result","reference",(RGBA *)local_418);
      if (!bVar6 || !bVar7) {
        outer._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(outer + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(outer + 2),
                   "Note: in the following reference visualization, points that are missing in result point set are blue (if any)"
                   ,0x6d);
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)outer,(EndMessageToken *)&tcu::TestLog::EndMessage
                               );
        local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        local_4e0._M_dataplus._M_p = (pointer)0x19;
        local_520._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_520,(ulong)&local_4e0);
        local_520.field_2._M_allocated_capacity = (size_type)local_4e0._M_dataplus._M_p;
        builtin_strncpy(local_520._M_dataplus._M_p,"RefTessCoordVisualization",0x19);
        local_520._M_string_length = (size_type)local_4e0._M_dataplus._M_p;
        local_520._M_dataplus._M_p[(long)local_4e0._M_dataplus._M_p] = '\0';
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        local_4b8 = 0x21;
        local_4e0._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_4e0,(ulong)&local_4b8);
        local_4e0.field_2._M_allocated_capacity = local_4b8;
        builtin_strncpy(local_4e0._M_dataplus._M_p,"Reference tessCoord visualization",0x21);
        local_4e0._M_string_length = local_4b8;
        local_4e0._M_dataplus._M_p[local_4b8] = '\0';
        pSVar15 = &refVisual;
        tcu::LogImage::LogImage
                  ((LogImage *)&inner,&local_520,&local_4e0,pSVar15,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&inner,(int)paVar12,__buf,(size_t)pSVar15);
        local_418 = (undefined1  [8])paVar12;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_410,
                   "Note: in the following result visualization, points that are missing in reference point set are red (if any)"
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_410);
        std::ios_base::~ios_base(local_3a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != local_268) {
          operator_delete(local_278._M_p,local_268[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_inner != &local_288) {
          operator_delete(_inner,(ulong)(local_288._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(outer + 2));
        std::ios_base::~ios_base(local_190);
      }
      outer._0_8_ = local_1f8;
      _inner = (pointer)0x19;
      outer._0_8_ = std::__cxx11::string::_M_create((ulong *)outer,(ulong)&inner);
      local_1f8[0]._M_allocated_capacity = _inner;
      builtin_strncpy((char *)outer._0_8_,"ResTessCoordVisualization",0x19);
      stack0xfffffffffffffe00 = _inner;
      *(char *)(outer._0_8_ + (long)_inner) = '\0';
      local_520._M_dataplus._M_p = (char *)0x1e;
      _inner = (pointer)&local_288;
      _inner = (pointer)std::__cxx11::string::_M_create((ulong *)&inner,(ulong)&local_520);
      local_288._M_allocated_capacity = (size_type)local_520._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xf) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x10) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x11) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x12) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x13) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x14) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x15) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x16) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x17) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x18) = 'z';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x19) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1a) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1b) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1c) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1d) = 'n';
      *(undefined8 *)_inner = 0x7420746c75736552;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 8) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 9) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 10) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xb) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xc) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xd) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xf) = 'd';
      local_290 = local_520._M_dataplus._M_p;
      _inner[(long)local_520._M_dataplus._M_p] = '\0';
      pSVar15 = &resVisual;
      tcu::LogImage::LogImage
                ((LogImage *)local_418,(string *)outer,(string *)&inner,pSVar15,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_418,(int)log,__buf_00,(size_t)pSVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_p != local_3e8) {
        operator_delete(local_3f8._M_p,local_3e8[0]._M_allocated_capacity + 1);
      }
      if (local_418 != (undefined1  [8])&local_408) {
        operator_delete((void *)local_418,(ulong)(local_408._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_inner != &local_288) {
        operator_delete(_inner,(ulong)(local_288._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outer._0_8_ != local_1f8) {
        operator_delete((void *)outer._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      bVar28 = local_4e4 != local_4e8;
      tcu::Surface::~Surface(&resVisual);
      tcu::Surface::~Surface(&refVisual);
      if (tfResult.varying.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(tfResult.varying.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)tfResult.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)tfResult.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar28 || (!bVar6 || !bVar7)) {
        description = "Invalid tessellation coordinates";
        goto LAB_003c352e;
      }
      local_418 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_410);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_410,"All OK",6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_410);
      std::ios_base::~ios_base(local_3a0);
      bVar27 = uVar19 < (uVar24 & 0x7fffffff);
      local_530 = local_530 + 0x18;
      bVar6 = uVar19 != (uVar24 & 0x7fffffff);
      uVar19 = uVar19 + 1;
    } while (bVar6);
    description = "Pass";
LAB_003c352e:
    testResult = (qpTestResult)bVar27;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  glu::ObjectWrapper::~ObjectWrapper(&tfHandler.m_tfPrimQuery.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&tfHandler.m_tfBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&tfHandler.m_tf.super_ObjectWrapper);
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::~vector(&caseReferences);
  if (__dest != (undefined8 *)0x0) {
    operator_delete(__dest,(long)puVar21 - (long)__dest);
  }
  return STOP;
}

Assistant:

TessCoordCase::IterateResult TessCoordCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();

	const int						tessLevelInner0Loc			= gl.getUniformLocation(programGL, "u_tessLevelInner0");
	const int						tessLevelInner1Loc			= gl.getUniformLocation(programGL, "u_tessLevelInner1");
	const int						tessLevelOuter0Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter0");
	const int						tessLevelOuter1Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter1");
	const int						tessLevelOuter2Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter2");
	const int						tessLevelOuter3Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter3");

	const vector<TessLevels>		tessLevelCases				= genTessLevelCases();
	vector<vector<Vec3> >			caseReferences				(tessLevelCases.size());

	for (int i = 0; i < (int)tessLevelCases.size(); i++)
		caseReferences[i] = generateReferenceTessCoords(m_primitiveType, m_spacing, &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]);

	const int						maxNumVertices				= (int)std::max_element(caseReferences.begin(), caseReferences.end(), SizeLessThan<vector<Vec3> >())->size();
	const TFHandler					tfHandler					(m_context.getRenderContext(), maxNumVertices);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const float* const innerLevels = &tessLevelCases[tessLevelCaseNdx].inner[0];
		const float* const outerLevels = &tessLevelCases[tessLevelCaseNdx].outer[0];

		log << TestLog::Message << "Tessellation levels: " << tessellationLevelsString(innerLevels, outerLevels, m_primitiveType) << TestLog::EndMessage;

		gl.uniform1f(tessLevelInner0Loc, innerLevels[0]);
		gl.uniform1f(tessLevelInner1Loc, innerLevels[1]);
		gl.uniform1f(tessLevelOuter0Loc, outerLevels[0]);
		gl.uniform1f(tessLevelOuter1Loc, outerLevels[1]);
		gl.uniform1f(tessLevelOuter2Loc, outerLevels[2]);
		gl.uniform1f(tessLevelOuter3Loc, outerLevels[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		{
			const vector<Vec3>&			tessCoordsRef	= caseReferences[tessLevelCaseNdx];
			const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, GL_POINTS, 0, DE_NULL, 1);

			if (tfResult.numPrimitives != (int)tessCoordsRef.size())
			{
				log << TestLog::Message << "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be "
										<< tfResult.numPrimitives << ", reference value is " << tessCoordsRef.size()
										<< " (logging further info anyway)" << TestLog::EndMessage;
				success = false;
			}
			else
				log << TestLog::Message << "Note: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be " << tfResult.numPrimitives << TestLog::EndMessage;

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
				log << TestLog::Message << "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively" << TestLog::EndMessage;
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				log << TestLog::Message << "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively" << TestLog::EndMessage;
			else
				DE_ASSERT(false);

			success = compareTessCoords(log, m_primitiveType, tessCoordsRef, tfResult.varying) && success;
		}

		if (!success)
			break;
		else
			log << TestLog::Message << "All OK" << TestLog::EndMessage;
	}

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Invalid tessellation coordinates");
	return STOP;
}